

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O1

void Rotate(Matrix *m,int i,Rotation *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  Vector lRow;
  Vector uRow;
  Vector local_60;
  Vector local_48;
  
  uVar5 = Matrix::GetCols(m);
  Matrix::GetRow(&local_48,m,i);
  Matrix::GetRow(&local_60,m,i + 1);
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      dVar1 = r->c;
      dVar2 = r->s;
      dVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      dVar4 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      pdVar6 = Matrix::operator()(m,i,(int)uVar7);
      *pdVar6 = dVar1 * dVar3 + dVar2 * dVar4;
      dVar1 = r->c;
      dVar2 = r->s;
      dVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      dVar4 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      pdVar6 = Matrix::operator()(m,i + 1,(int)uVar7);
      *pdVar6 = dVar1 * dVar4 - dVar2 * dVar3;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Rotate(Matrix &m, int i, const Rotation &r)
{
    const int n = m.GetCols();

    Vector uRow = m.GetRow(i);
    Vector lRow = m.GetRow(i + 1);

    for (int k = 0; k < n; k++)
    {
        m(i, k) = r.c * uRow[k] + r.s * lRow[k];
        m(i + 1, k) = -r.s * uRow[k] + r.c * lRow[k];
    }
}